

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O0

void duckdb::ThrowForeignKeyConstraintError
               (idx_t failed_index,bool is_append,Index *conflict_index,DataChunk *input)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  byte in_SIL;
  undefined8 in_RDI;
  string message;
  VerifyExistenceType verify_type;
  BoundIndex *index;
  string *in_stack_ffffffffffffff88;
  Index *in_stack_ffffffffffffff90;
  ConstraintException *this;
  ConstraintException local_50 [2];
  byte local_29;
  BoundIndex *local_28;
  undefined8 local_20;
  byte local_9;
  undefined8 local_8;
  
  local_9 = in_SIL & 1;
  local_20 = in_RCX;
  local_8 = in_RDI;
  local_28 = Index::Cast<duckdb::BoundIndex>(in_stack_ffffffffffffff90);
  local_29 = 2 - (local_9 & 1);
  this = local_50;
  (*(local_28->super_Index)._vptr_Index[0x16])(this,local_28,(ulong)local_29,local_8,local_20);
  uVar1 = __cxa_allocate_exception(0x10);
  ConstraintException::ConstraintException(this,in_stack_ffffffffffffff88);
  __cxa_throw(uVar1,&ConstraintException::typeinfo,ConstraintException::~ConstraintException);
}

Assistant:

[[noreturn]] static void ThrowForeignKeyConstraintError(idx_t failed_index, bool is_append, Index &conflict_index,
                                                        DataChunk &input) {
	// The index that caused the conflict has to be bound by this point (or we would not have gotten here)
	D_ASSERT(conflict_index.IsBound());
	auto &index = conflict_index.Cast<BoundIndex>();
	auto verify_type = is_append ? VerifyExistenceType::APPEND_FK : VerifyExistenceType::DELETE_FK;
	D_ASSERT(failed_index != DConstants::INVALID_INDEX);
	auto message = index.GetConstraintViolationMessage(verify_type, failed_index, input);
	throw ConstraintException(message);
}